

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBoundedSurface,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcBoundedSurface *in;
  
  in = (IfcBoundedSurface *)operator_new(0x58);
  *(undefined ***)&(in->super_IfcSurface).field_0x40 = &PTR__Object_007e6a70;
  *(undefined8 *)&in->field_0x48 = 0;
  *(char **)&in->field_0x50 = "IfcBoundedSurface";
  Assimp::IFC::Schema_2x3::IfcSurface::IfcSurface
            ((IfcSurface *)in,&PTR_construction_vtable_24__0085c808);
  (in->super_IfcSurface).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcBoundedSurface_0085c750;
  *(undefined ***)&(in->super_IfcSurface).field_0x40 = &PTR__IfcBoundedSurface_0085c7f0;
  *(undefined ***)
   &(in->super_IfcSurface).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcBoundedSurface_0085c778;
  *(undefined ***)
   &(in->super_IfcSurface).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcBoundedSurface_0085c7a0;
  *(undefined ***)&(in->super_IfcSurface).super_IfcGeometricRepresentationItem.field_0x30 =
       &PTR__IfcBoundedSurface_0085c7c8;
  GenericFill<Assimp::IFC::Schema_2x3::IfcBoundedSurface>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcSurface).super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcSurface).super_IfcGeometricRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }